

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::PopStackPolymorphic
          (WasmBytecodeGenerator *this,PolymorphicEmitInfo expectedTypes,char16 *mismatchMessage)

{
  EmitInfo *pEVar1;
  EmitInfo EVar2;
  uint32 count;
  uint32 index;
  undefined1 local_58 [8];
  PolymorphicEmitInfo expectedTypes_local;
  PolymorphicEmitInfo info;
  
  expectedTypes_local._0_8_ = expectedTypes.field_1;
  count = expectedTypes.count;
  expectedTypes_local.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)0;
  local_58._0_4_ = count;
  PolymorphicEmitInfo::Init
            ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo,count,&this->m_alloc);
  if (count != 0) {
    index = 0;
    do {
      if (this->isUnreachable == true) {
        pEVar1 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                           ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *
                            )&this->m_evalStack,
                            (this->m_evalStack).list.
                            super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                            .count + -1);
        EVar2.super_EmitInfoBase.location = 0xffffffff;
        EVar2.type = Any;
        if (pEVar1->type != Limit) goto LAB_00f35ea9;
      }
      else {
LAB_00f35ea9:
        EVar2 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_58,index);
        EVar2 = PopEvalStack(this,EVar2.type,mismatchMessage);
      }
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo,EVar2,index);
      index = index + 1;
    } while (count != index);
  }
  return (PolymorphicEmitInfo)
         ZEXT416((uint)expectedTypes_local.field_1.singleInfo.super_EmitInfoBase.location);
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::PopStackPolymorphic(PolymorphicEmitInfo expectedTypes, const char16* mismatchMessage /*= nullptr*/)
{
    PolymorphicEmitInfo info;
    uint32 count = expectedTypes.Count();
    info.Init(count, &m_alloc);

    for (uint32 i = 0; i < count; ++i)
    {
        // Check the stack before popping, it is valid to yield nothing if we are Unreachable
        if (IsUnreachable() && m_evalStack.Peek().type == WasmTypes::Limit)
        {
            info.SetInfo(EmitInfo(WasmTypes::Any), i);
        }
        else
        {
            info.SetInfo(PopEvalStack(expectedTypes.GetInfo(i).type, mismatchMessage), i);
        }
    }
    return info;
}